

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BailOutRecord::BailOutForElidedYield(void *framePointer)

{
  bool bVar1;
  ImplicitCallFlags flags;
  RegSlot localRegisterID;
  InterpreterStackFrame *this;
  ScriptContext *this_00;
  ThreadContext *this_01;
  DynamicProfileInfo *this_02;
  void *unaff_retaddr;
  Var local_a0;
  DynamicProfileInfo *dynamicProfileInfo;
  undefined1 local_70 [8];
  PushPopFrameHelper pushPopFrameHelper;
  Var aReturn;
  ThreadContext *threadContext;
  InterpreterStackFrame *frame;
  JavascriptGenerator *generator;
  FunctionBody *pFStack_30;
  bool isInDebugMode;
  FunctionBody *executeFunction;
  ScriptFunction *function;
  ScriptFunction **functionRef;
  JavascriptCallStackLayout *layout;
  void *framePointer_local;
  
  layout = (JavascriptCallStackLayout *)framePointer;
  function = (ScriptFunction *)Js::JavascriptCallStackLayout::FromFramePointer(framePointer);
  executeFunction =
       (FunctionBody *)
       (function->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
       super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
       _vptr_IRecyclerVisitedObject;
  functionRef = (ScriptFunction **)function;
  pFStack_30 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)executeFunction);
  generator._7_1_ = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFStack_30);
  frame = (InterpreterStackFrame *)functionRef[2];
  this = Js::JavascriptGenerator::GetFrame((JavascriptGenerator *)frame);
  this_00 = Js::InterpreterStackFrame::GetScriptContext(this);
  this_01 = Js::ScriptContext::GetThreadContext(this_00);
  localRegisterID = Js::FunctionBody::GetYieldRegister(pFStack_30);
  Js::InterpreterStackFrame::SetNonVarReg(this,localRegisterID,functionRef[3]);
  *(InterpreterStackFrame ***)(this + 0xb8) = &frame;
  Js::FunctionBody::BeginExecution(pFStack_30);
  pushPopFrameHelper.m_isHiddenFrame = false;
  pushPopFrameHelper._17_7_ = 0;
  Js::InterpreterStackFrame::PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)local_70,this,unaff_retaddr,&stack0x00000000);
  if ((generator._7_1_ & 1) == 0) {
    local_a0 = Js::InterpreterStackFrame::Process(this);
  }
  else {
    local_a0 = Js::InterpreterStackFrame::DebugProcess(this);
  }
  pushPopFrameHelper._16_8_ = local_a0;
  Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)local_70)
  ;
  Js::FunctionBody::EndExecution(pFStack_30);
  bVar1 = Js::FunctionBody::HasDynamicProfileInfo(pFStack_30);
  if (bVar1) {
    this_02 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFStack_30);
    flags = ThreadContext::GetImplicitCallFlags(this_01);
    Js::DynamicProfileInfo::RecordImplicitCallFlags(this_02,flags);
  }
  return (Var)pushPopFrameHelper._16_8_;
}

Assistant:

Js::Var BailOutRecord::BailOutForElidedYield(void * framePointer)
{
    JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(NoSaveRegistersBailOutForElidedYield);
    Js::JavascriptCallStackLayout * const layout = Js::JavascriptCallStackLayout::FromFramePointer(framePointer);
    Js::ScriptFunction ** functionRef = (Js::ScriptFunction **)&layout->functionObject;
    Js::ScriptFunction * function = *functionRef;
    Js::FunctionBody * executeFunction = function->GetFunctionBody();
#ifdef ENABLE_SCRIPT_DEBUGGING
    bool isInDebugMode = executeFunction->IsInDebugMode();
#endif

    Js::JavascriptGenerator* generator = static_cast<Js::JavascriptGenerator*>(layout->args[0]);
    Js::InterpreterStackFrame* frame = generator->GetFrame();
    ThreadContext *threadContext = frame->GetScriptContext()->GetThreadContext();

    frame->SetNonVarReg(executeFunction->GetYieldRegister(), layout->args[1]);

    // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
    // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
    frame->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);

    executeFunction->BeginExecution();

    Js::Var aReturn = nullptr;

    {
        // Following _AddressOfReturnAddress <= real address of "returnAddress". Suffices for RemoteStackWalker to test partially initialized interpreter frame.
        Js::InterpreterStackFrame::PushPopFrameHelper pushPopFrameHelper(frame, _ReturnAddress(), _AddressOfReturnAddress());
#ifdef ENABLE_SCRIPT_DEBUGGING
        aReturn = isInDebugMode ? frame->DebugProcess() : frame->Process();
#else
        aReturn = frame->Process();
#endif
        // Note: in debug mode we always have to bailout to debug thunk,
        //       as normal interpreter thunk expects byte code compiled w/o debugging.
    }

    executeFunction->EndExecution();

    if (executeFunction->HasDynamicProfileInfo())
    {
        Js::DynamicProfileInfo *dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
    }

    return aReturn;
    JIT_HELPER_END(NoSaveRegistersBailOutForElidedYield);
}